

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O3

Gia_Man_t * Jf_ManDeriveCnf(Gia_Man_t *p,int fCnfObjIds)

{
  Gia_Man_t *pGVar1;
  Jf_Par_t local_110;
  
  memset(&local_110.nProcNum,0,0xf0);
  local_110.nLutSize = 6;
  local_110.nCutNum = 8;
  local_110.nRounds = 1;
  local_110.nVerbLimit = 5;
  local_110.DelayTarget = -1;
  local_110.fAreaOnly = 1;
  local_110.fOptEdge = 1;
  local_110.fFuncDsd = 0;
  local_110.fGenCnf = 1;
  local_110.fCoarsen = 0;
  local_110.fCutMin = 0;
  local_110.nLutSizeMax = 8;
  local_110.nCutNumMax = 0x10;
  local_110.fCnfObjIds = fCnfObjIds;
  pGVar1 = Jf_ManPerformMapping(p,&local_110);
  return pGVar1;
}

Assistant:

Gia_Man_t * Jf_ManDeriveCnf( Gia_Man_t * p, int fCnfObjIds )
{
    Jf_Par_t Pars, * pPars = &Pars;
    Jf_ManSetDefaultPars( pPars );
    pPars->fGenCnf = 1;
    pPars->fCnfObjIds = fCnfObjIds;
    return Jf_ManPerformMapping( p, pPars );
}